

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::PushBigChunk(ON_BinaryArchive *this,ON__UINT32 typecode,ON__INT64 big_value)

{
  int iVar1;
  bool bVar2;
  bool local_71;
  int local_70;
  ulong uStack_58;
  bool bLongChunk;
  ON__UINT64 sizeof_crc;
  ON__UINT64 length;
  ON_3DM_BIG_CHUNK c;
  ON__INT64 big_value_local;
  ON__UINT32 typecode_local;
  ON_BinaryArchive *this_local;
  
  c._32_8_ = big_value;
  ON_3DM_BIG_CHUNK::ON_3DM_BIG_CHUNK((ON_3DM_BIG_CHUNK *)&length);
  memset(&length,0,0x28);
  c.m_end_offset._0_1_ = c.m_do_crc16;
  c.m_end_offset._1_1_ = c.m_do_crc32;
  c.m_end_offset._2_2_ = c.m_crc16;
  c.m_end_offset._4_4_ = c.m_crc32;
  sizeof_crc = 0;
  uStack_58 = 0;
  bVar2 = false;
  c.m_big_value._0_4_ = typecode;
  if ((typecode & 0x80000000) == 0) {
    if (typecode == 0) {
      iVar1 = Archive3dmVersion(this);
      bVar2 = false;
      if (iVar1 == 1) goto LAB_0049d121;
    }
    bVar2 = -1 < (long)c._32_8_;
  }
LAB_0049d121:
  if (bVar2) {
    sizeof_crc._0_1_ = c.m_do_crc16;
    sizeof_crc._1_1_ = c.m_do_crc32;
    sizeof_crc._2_2_ = c.m_crc16;
    sizeof_crc._4_4_ = c.m_crc32;
    if ((this->m_3dm_version == 1) && ((typecode & 0x10000) != 0)) {
      c.m_typecode._0_1_ = '\x01';
      c.m_typecode._2_2_ = 1;
    }
    else if (typecode == 0x2fffd) {
      if (this->m_3dm_version == 1) {
        c.m_typecode._0_1_ = '\x01';
        c.m_typecode._2_2_ = 1;
      }
      else {
        c.m_typecode._1_1_ = '\x01';
        c.m_bLongChunk = '\0';
        c.m_reserved1 = '\0';
        c.m_reserved2 = '\0';
        c.m_reserved3 = '\0';
      }
    }
    else if (typecode == 0x2000013) {
      if (this->m_3dm_version == 1) {
        c.m_typecode._0_1_ = '\x01';
        c.m_typecode._2_2_ = 1;
      }
    }
    else if ((this->m_3dm_version != 1) && ((typecode & 0x8000) != 0)) {
      c.m_typecode._1_1_ = '\x01';
      c.m_bLongChunk = '\0';
      c.m_reserved1 = '\0';
      c.m_reserved2 = '\0';
      c.m_reserved3 = '\0';
    }
    c.m_big_value._4_1_ = 1;
    if (c.m_typecode._1_1_ == '\0') {
      local_70 = 0;
      if ((char)c.m_typecode != '\0') {
        local_70 = 2;
      }
    }
    else {
      local_70 = 4;
    }
    uStack_58 = (ulong)local_70;
  }
  length = CurrentPosition(this);
  c.m_start_offset = length;
  bVar2 = ReadMode(this);
  if ((bVar2) && (uStack_58 < sizeof_crc)) {
    c.m_start_offset = (sizeof_crc - uStack_58) + c.m_start_offset;
  }
  local_71 = (char)c.m_typecode != '\0' || c.m_typecode._1_1_ != '\0';
  this->m_bDoChunkCRC = local_71;
  iVar1 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Capacity(&this->m_chunk);
  if (iVar1 == 0) {
    ON_SimpleArray<ON_3DM_BIG_CHUNK>::Reserve(&this->m_chunk,0x80);
  }
  ON_SimpleArray<ON_3DM_BIG_CHUNK>::Append(&this->m_chunk,(ON_3DM_BIG_CHUNK *)&length);
  return true;
}

Assistant:

bool ON_BinaryArchive::PushBigChunk( ON__UINT32 typecode, ON__INT64 big_value )
{
  ON_3DM_BIG_CHUNK c;
  memset(&c,0,sizeof(c));
  c.m_typecode  = typecode;
  c.m_big_value = big_value;
  ON__UINT64 length = 0;
  ON__UINT64 sizeof_crc = 0;

  // | and & are BITOPS - do NOT change to || and &&
  //
  // Some v1 files have a short chunk with typecode = 0.
  //
  // NOTE: RenderXXXX plug-in used zero as a typecode in material userdata, sigh ...
  // so ... const bool bLongChunk = (0 != typecode && 0 == (TCODE_SHORT & typecode)); doesn't work.
  //
  const bool bLongChunk = (0 == (TCODE_SHORT & typecode) && (0 != typecode || 1 != Archive3dmVersion()) && big_value >= 0 );
  if ( bLongChunk )
  {
    length = (ON__UINT64)big_value;

    if ( m_3dm_version == 1 && 0 != (TCODE_LEGACY_GEOMETRY & typecode) )
    {
      // these legacy typecodes have 16 bit CRCs
      c.m_do_crc16 = 1;
      c.m_crc16 = 1;
    }
    else 
    {
      // some other legacy typecodes that have 16 bit CRCs
      switch(typecode) 
      {

      case TCODE_SUMMARY:
        if ( m_3dm_version == 1 ) 
        {
          c.m_do_crc16 = 1;
          c.m_crc16 = 1;
        }
        break;

      case TCODE_OPENNURBS_OBJECT | TCODE_CRC | 0x7FFD:
        if ( m_3dm_version == 1 ) 
        {
          // 1.1 uuid has a 16 bit crc
          c.m_do_crc16 = 1;
          c.m_crc16 = 1;
        }
        else 
        {
          // 2.0 uuid has a 32 bit crc
          c.m_do_crc32 = 1;
          c.m_crc32 = 0;
        }
        break;

      default:
        if ( m_3dm_version != 1 && 0 != (TCODE_CRC & typecode) ) 
        {
          // 32 bit CRC
          c.m_do_crc32 = 1;
          c.m_crc32 = 0;
        }
        break;

      }
    }

    c.m_bLongChunk = 1;
    sizeof_crc = c.m_do_crc32 ? 4 : (c.m_do_crc16 ? 2 : 0);
  }

  c.m_start_offset = CurrentPosition();
  c.m_end_offset = c.m_start_offset;
  if (ReadMode() && length > sizeof_crc)
    c.m_end_offset += (length - sizeof_crc);
  m_bDoChunkCRC = c.m_do_crc16 || c.m_do_crc32;
  
  if ( m_chunk.Capacity() == 0 )
    m_chunk.Reserve(128);
  m_chunk.Append( c );

  return true;
}